

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O3

void __thiscall
cbtDbvt::collideTV(cbtDbvt *this,cbtDbvtNode *root,cbtDbvtVolume *vol,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  uint uVar2;
  int iVar3;
  cbtDbvtNode **ppcVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  char tempmemory [512];
  cbtAlignedObjectArray<const_cbtDbvtNode_*> local_270;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_240;
  float local_23c;
  cbtDbvtNode *local_238 [65];
  
  if (root != (cbtDbvtNode *)0x0) {
    local_248 = (vol->mi).m_floats[1];
    local_250 = (vol->mi).m_floats[2];
    local_240 = (vol->mi).m_floats[0];
    uVar6 = 1;
    local_23c = (vol->mx).m_floats[0];
    local_244 = (vol->mx).m_floats[1];
    local_24c = (vol->mx).m_floats[2];
    local_270.m_size = 0;
    local_270.m_capacity = 0x40;
    local_270.m_data = local_238;
    local_270.m_ownsMemory = false;
    local_238[0] = root;
    do {
      uVar5 = (uint)uVar6;
      uVar2 = uVar5 - 1;
      uVar6 = (ulong)uVar2;
      pcVar1 = local_270.m_data[uVar6];
      local_270.m_size = uVar2;
      if ((((((pcVar1->volume).mi.m_floats[0] <= local_23c) &&
            (local_240 <= (pcVar1->volume).mx.m_floats[0])) &&
           ((pcVar1->volume).mi.m_floats[1] <= local_244)) &&
          ((local_248 <= (pcVar1->volume).mx.m_floats[1] &&
           ((pcVar1->volume).mi.m_floats[2] <= local_24c)))) &&
         (local_250 <= (pcVar1->volume).mx.m_floats[2])) {
        if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
          (*policy->_vptr_ICollide[3])(policy,pcVar1);
          uVar6 = local_270._4_8_ & 0xffffffff;
        }
        else {
          uVar8 = local_270.m_capacity;
          if (uVar2 == local_270.m_capacity) {
            uVar8 = uVar2 * 2;
            if (uVar2 == 0) {
              uVar8 = 1;
            }
            if (uVar5 <= uVar8) {
              ppcVar4 = (cbtDbvtNode **)cbtAlignedAllocInternal((ulong)uVar8 << 3,0x10);
              if (0 < (long)local_270.m_size) {
                lVar7 = 0;
                do {
                  ppcVar4[lVar7] = local_270.m_data[lVar7];
                  lVar7 = lVar7 + 1;
                } while (local_270.m_size != lVar7);
              }
              iVar3 = local_270.m_size;
              if ((local_270.m_data != (cbtDbvtNode **)0x0) && (local_270.m_ownsMemory == true)) {
                cbtAlignedFreeInternal(local_270.m_data);
                iVar3 = local_270.m_size;
              }
              uVar6 = (ulong)iVar3;
              local_270.m_ownsMemory = true;
              local_270._4_8_ = (ulong)uVar8 << 0x20;
              uVar5 = iVar3 + 1;
              local_270.m_data = ppcVar4;
              goto LAB_008a5671;
            }
            local_270.m_data[uVar6] = (pcVar1->field_2).childs[0];
          }
          else {
LAB_008a5671:
            local_270.m_data[uVar6] = (pcVar1->field_2).childs[0];
            local_270.m_size = uVar5;
            if (uVar5 == uVar8) {
              uVar2 = uVar8 * 2;
              if (uVar8 == 0) {
                uVar2 = 1;
              }
              uVar5 = uVar8;
              if ((int)uVar8 < (int)uVar2) {
                if (uVar2 == 0) {
                  ppcVar4 = (cbtDbvtNode **)0x0;
                }
                else {
                  ppcVar4 = (cbtDbvtNode **)cbtAlignedAllocInternal((long)(int)uVar2 << 3,0x10);
                  uVar8 = local_270.m_size;
                }
                if (0 < (int)uVar8) {
                  uVar6 = 0;
                  do {
                    ppcVar4[uVar6] = local_270.m_data[uVar6];
                    uVar6 = uVar6 + 1;
                  } while (uVar8 != uVar6);
                }
                uVar5 = uVar8;
                if ((local_270.m_data != (cbtDbvtNode **)0x0) && (local_270.m_ownsMemory == true)) {
                  cbtAlignedFreeInternal(local_270.m_data);
                  uVar5 = local_270.m_size;
                }
                local_270.m_ownsMemory = true;
                local_270._4_8_ = (ulong)uVar2 << 0x20;
                local_270.m_data = ppcVar4;
              }
            }
          }
          local_270.m_data[(int)uVar5] = (pcVar1->field_2).childs[1];
          uVar6 = (ulong)(uVar5 + 1);
          local_270.m_size = uVar5 + 1;
        }
      }
    } while (0 < (int)uVar6);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&local_270);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::collideTV(const cbtDbvtNode* root,
							  const cbtDbvtVolume& vol,
							  DBVT_IPOLICY) const
{
	DBVT_CHECKTYPE
	if (root)
	{
		ATTRIBUTE_ALIGNED16(cbtDbvtVolume)
		volume(vol);
		cbtAlignedObjectArray<const cbtDbvtNode*> stack;
		stack.resize(0);
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		char tempmemory[SIMPLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
		stack.initializeFromBuffer(tempmemory, 0, SIMPLE_STACKSIZE);
#else
		stack.reserve(SIMPLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY

		stack.push_back(root);
		do
		{
			const cbtDbvtNode* n = stack[stack.size() - 1];
			stack.pop_back();
			if (Intersect(n->volume, volume))
			{
				if (n->isinternal())
				{
					stack.push_back(n->childs[0]);
					stack.push_back(n->childs[1]);
				}
				else
				{
					policy.Process(n);
				}
			}
		} while (stack.size() > 0);
	}
}